

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genAggLoopStringCompressed
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,size_t currentLoop,
          size_t depth,dyn_bitset *contributingViews,size_t numOfOutViewLoops,string *resetString)

{
  pointer pvVar1;
  pointer pvVar2;
  long *plVar3;
  pointer pvVar4;
  size_t sVar5;
  pointer pvVar6;
  long lVar7;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  bool bVar8;
  size_type sVar9;
  size_t sVar10;
  iterator iVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  AggRegTuple *pAVar15;
  long lVar16;
  ulong uVar17;
  prod_bitset *ppVar18;
  AggregateIndexes *pAVar19;
  string *this_00;
  prod_bitset *ppVar20;
  AggregateIndexes *pAVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  _Base_bitset<24UL> *this_01;
  long *plVar25;
  long lVar26;
  bool bVar27;
  byte bVar28;
  long local_6e8;
  size_t local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  string resetAggregates;
  size_t depth_local;
  string productString;
  ulong local_668;
  string local;
  string local_640;
  bitset<7UL> increasingIndexes;
  size_t thisLoopID;
  long local_5e0;
  dyn_bitset *local_5d8;
  size_t nextLoop;
  prod_bitset removedFunctions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  prod_bitset subProduct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  size_t local_408;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_400;
  ulong local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string depthString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar28 = 0;
  local_400 = (this->listOfLoops).
              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + currentLoop;
  depth_local = depth;
  thisLoopID = currentLoop;
  local_5d8 = contributingViews;
  sVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(local_400);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&subProduct);
  std::__cxx11::to_string(&depthString,depth);
  local_5e0 = sVar9 + numOfOutViewLoops;
  lVar26 = local_5e0 + 3;
  lVar23 = local_5e0 + depth;
  local_408 = currentLoop;
  for (uVar17 = 0;
      pvVar1 = (this->localProductList).
               super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar16 = *(long *)&pvVar1[currentLoop].
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         ._M_impl.super__Vector_impl_data,
      uVar17 < (ulong)(((long)*(pointer *)
                               ((long)&pvVar1[currentLoop].
                                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar16) / 0xc0);
      uVar17 = uVar17 + 1) {
    std::__cxx11::string::string((string *)&productString,"",(allocator *)&subProduct);
    this_01 = (_Base_bitset<24UL> *)(lVar16 + uVar17 * 0xc0);
    sVar10 = std::_Base_bitset<24UL>::_M_do_count(this_01);
    if (sVar10 < 2) {
LAB_001b9d7b:
      genProductString_abi_cxx11_((string *)&subProduct,this,node,local_5d8,(prod_bitset *)this_01);
      std::__cxx11::string::append((string *)&productString);
      this_00 = (string *)&subProduct;
    }
    else {
      memcpy((string *)&subProduct,this_01,0xc0);
      bVar27 = false;
      memset(&removedFunctions,0,0xc0);
      while (!bVar27) {
        do {
          sVar10 = std::_Base_bitset<24UL>::_M_do_count((_Base_bitset<24UL> *)&subProduct);
          if (sVar10 < 2) goto LAB_001b9d7b;
          uVar22 = 0x5dc;
          do {
            uVar14 = uVar22;
            if (uVar14 == 0) break;
            uVar22 = uVar14 - 1;
          } while ((subProduct.super__Base_bitset<24UL>._M_w[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) ==
                   0);
          std::bitset<1500UL>::reset((bitset<1500UL> *)&subProduct,uVar14);
          std::bitset<1500UL>::set(&removedFunctions,uVar14,true);
          iVar11 = std::
                   _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->localProductMap).
                           super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[currentLoop]._M_h,
                          (key_type *)&subProduct);
        } while (iVar11.
                 super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                 ._M_cur == (__node_type *)0x0);
        bVar27 = *(ulong *)((long)iVar11.
                                  super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                                  ._M_cur + 200) < uVar17;
        if (bVar27) {
          local_668 = *(ulong *)((long)iVar11.
                                       super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                                       ._M_cur + 200);
        }
      }
      std::__cxx11::to_string
                (&local,*(unsigned_long *)
                         (*(long *)&(this->localProductRemapping).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data + local_668 * 8));
      std::operator+(&local_6d0,"localRegister[",&local);
      std::operator+(&resetAggregates,&local_6d0,"]*");
      std::__cxx11::string::append((string *)&productString);
      std::__cxx11::string::~string((string *)&resetAggregates);
      std::__cxx11::string::~string((string *)&local_6d0);
      iVar11 = std::
               _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->localProductMap).
                       super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[currentLoop]._M_h,&removedFunctions
                     );
      if ((iVar11.
           super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>.
           _M_cur == (__node_type *)0x0) ||
         (uVar22 = *(ulong *)((long)iVar11.
                                    super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                                    ._M_cur + 200), uVar17 <= uVar22)) {
        genProductString_abi_cxx11_(&resetAggregates,this,node,local_5d8,&removedFunctions);
        std::__cxx11::string::append((string *)&productString);
        std::__cxx11::string::~string((string *)&resetAggregates);
      }
      else {
        std::__cxx11::to_string
                  (&resetAggregates,
                   *(unsigned_long *)
                    (*(long *)&(this->localProductRemapping).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data + uVar22 * 8));
        std::__cxx11::string::operator=((string *)&local,(string *)&resetAggregates);
        std::__cxx11::string::~string((string *)&resetAggregates);
        std::operator+(&local_6d0,"localRegister[",&local);
        std::operator+(&resetAggregates,&local_6d0,"]");
        std::__cxx11::string::append((string *)&productString);
        std::__cxx11::string::~string((string *)&resetAggregates);
        std::__cxx11::string::~string((string *)&local_6d0);
        local_668 = uVar22;
      }
      this_00 = &local;
    }
    std::__cxx11::string::~string((string *)this_00);
    offset_abi_cxx11_((string *)&increasingIndexes,this,lVar23 + 3);
    std::operator+(&local_6d0,(string *)&increasingIndexes,"localRegister[");
    std::__cxx11::to_string(&local_640,this->productCounter);
    std::operator+(&resetAggregates,&local_6d0,&local_640);
    std::operator+(&local,&resetAggregates,"] = ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &removedFunctions,&local,&productString);
    std::operator+((string *)&subProduct,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &removedFunctions,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&subProduct);
    std::__cxx11::string::~string((string *)&removedFunctions);
    std::__cxx11::string::~string((string *)&local);
    std::__cxx11::string::~string((string *)&resetAggregates);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&increasingIndexes);
    sVar10 = this->productCounter;
    *(size_t *)
     (*(long *)&(this->localProductRemapping).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data + uVar17 * 8) = sVar10;
    this->productCounter = sVar10 + 1;
    std::__cxx11::string::~string((string *)&productString);
  }
  sVar10 = lVar26 + depth;
  for (uVar17 = 0;
      pvVar2 = (this->viewProductList).
               super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar17 < (ulong)(((long)*(pointer *)
                               ((long)&pvVar2[currentLoop].
                                       super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                       *(long *)&pvVar2[currentLoop].
                                 super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data) / 0x18); uVar17 = uVar17 + 1) {
    std::__cxx11::string::string((string *)&subProduct,"",(allocator *)&removedFunctions);
    lVar23 = *(long *)&(this->viewProductList).
                       super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                       super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    plVar3 = *(long **)(lVar23 + 8 + uVar17 * 0x18);
    for (plVar25 = *(long **)(lVar23 + uVar17 * 0x18); plVar25 != plVar3; plVar25 = plVar25 + 2) {
      std::operator+(&resetAggregates,"aggregates_",this->viewName + *plVar25);
      std::operator+(&local,&resetAggregates,"[");
      std::__cxx11::to_string(&local_6d0,plVar25[1]);
      std::operator+(&productString,&local,&local_6d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,&productString,"]*");
      std::__cxx11::string::append((string *)&subProduct);
      std::__cxx11::string::~string((string *)&removedFunctions);
      std::__cxx11::string::~string((string *)&productString);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local);
      std::__cxx11::string::~string((string *)&resetAggregates);
    }
    std::__cxx11::string::pop_back();
    offset_abi_cxx11_((string *)&increasingIndexes,this,sVar10);
    std::operator+(&local_6d0,(string *)&increasingIndexes,"viewRegister[");
    std::__cxx11::to_string(&local_640,this->viewCounter);
    std::operator+(&resetAggregates,&local_6d0,&local_640);
    std::operator+(&local,&resetAggregates,"] = ");
    std::operator+(&productString,&local,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subProduct)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &removedFunctions,&productString,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&removedFunctions);
    std::__cxx11::string::~string((string *)&productString);
    std::__cxx11::string::~string((string *)&local);
    std::__cxx11::string::~string((string *)&resetAggregates);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&increasingIndexes);
    sVar12 = this->viewCounter;
    *(size_t *)
     (*(long *)&(this->viewProductRemapping).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data + uVar17 * 8) = sVar12;
    this->viewCounter = sVar12 + 1;
    std::__cxx11::string::~string((string *)&subProduct);
  }
  sVar12 = local_5e0 + depth + 4;
  uVar17 = 0;
  while (b = local_400,
        pvVar4 = (this->nextLoopsPerLoop).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar23 = *(long *)&pvVar4[currentLoop].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data,
        uVar17 < (ulong)((long)*(pointer *)
                                ((long)&pvVar4[currentLoop].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar23 >> 3)) {
    sVar5 = *(size_t *)(lVar23 + uVar17 * 8);
    nextLoop = sVar5;
    local_3f8 = uVar17;
    boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&subProduct,
                     (this->listOfLoops).
                     super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + sVar5,local_400);
    bVar27 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &subProduct,b);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&subProduct);
    if (!bVar27) break;
    sVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      ((this->viewsPerLoop).
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar5);
    std::__cxx11::string::string((string *)&productString,"",(allocator *)&subProduct);
    std::__cxx11::string::string((string *)&local,"",(allocator *)&subProduct);
    sVar13 = QueryCompiler::numberOfViews
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    if (sVar9 < sVar13) {
      offset_abi_cxx11_(&local_90,this,sVar10);
      std::operator+(&local_70,&local_90,"ptr_");
      std::operator+(&local_50,&local_70,this->viewName + sVar9);
      std::operator+(&local_310,&local_50," = lowerptr_");
      std::operator+(&local_2f0,&local_310,this->viewName + sVar9);
      std::operator+(&local_2d0,&local_2f0,"[");
      std::operator+(&local_2b0,&local_2d0,&depthString);
      std::operator+(&local_3f0,&local_2b0,"];\n");
      offset_abi_cxx11_(&local_b0,this,sVar10);
      std::operator+(&local_150,&local_3f0,&local_b0);
      std::operator+(&local_290,&local_150,"while(ptr_");
      std::operator+(&local_130,&local_290,this->viewName + sVar9);
      std::operator+(&local_270,&local_130," <= upperptr_");
      std::operator+(&local_250,&local_270,this->viewName + sVar9);
      std::operator+(&local_3d0,&local_250,"[");
      std::operator+(&local_230,&local_3d0,&depthString);
      std::operator+(&local_3b0,&local_230,"])\n");
      offset_abi_cxx11_(&local_d0,this,sVar10);
      std::operator+(&local_210,&local_3b0,&local_d0);
      std::operator+(&local_390,&local_210,"{\n");
      offset_abi_cxx11_(&local_f0,this,sVar12);
      std::operator+(&local_1f0,&local_390,&local_f0);
      std::operator+(&local_1d0,&local_1f0,this->viewName + sVar9);
      std::operator+(&local_1b0,&local_1d0,"_tuple &");
      std::operator+(&local_370,&local_1b0,this->viewName + sVar9);
      std::operator+(&local_190,&local_370,"Tuple = ");
      std::operator+(&local_350,&local_190,this->viewName + sVar9);
      std::operator+(&local_170,&local_350,"[ptr_");
      std::operator+(&local_508,&local_170,this->viewName + sVar9);
      std::operator+(&local_428,&local_508,"];\n");
      offset_abi_cxx11_(&local_110,this,sVar12);
      std::operator+(&local_640,&local_428,&local_110);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,&local_640,"double *aggregates_");
      std::operator+(&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,this->viewName + sVar9);
      std::operator+(&resetAggregates,&local_6d0," = ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,&resetAggregates,this->viewName + sVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &subProduct,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,"Tuple.aggregates;\n");
      std::__cxx11::string::append((string *)&productString);
      std::__cxx11::string::~string((string *)&subProduct);
      std::__cxx11::string::~string((string *)&removedFunctions);
      std::__cxx11::string::~string((string *)&resetAggregates);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      offset_abi_cxx11_(&local_428,this,sVar12);
      std::operator+(&local_640,&local_428,"++ptr_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,&local_640,this->viewName + sVar9);
      std::operator+(&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,";\n");
      offset_abi_cxx11_(&local_508,this,sVar10);
      std::operator+(&resetAggregates,&local_6d0,&local_508);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,&resetAggregates,"}\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &subProduct,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,&local);
      std::__cxx11::string::append((string *)&local);
      std::__cxx11::string::~string((string *)&subProduct);
    }
    else {
      offset_abi_cxx11_(&local_2b0,this,sVar10);
      std::operator+(&local_3f0,&local_2b0,"ptr_");
      std::operator+(&local_150,&local_3f0,&node->_name);
      std::operator+(&local_290,&local_150," = lowerptr_");
      std::operator+(&local_130,&local_290,&node->_name);
      std::operator+(&local_270,&local_130,"[");
      std::operator+(&local_250,&local_270,&depthString);
      std::operator+(&local_3d0,&local_250,"];\n");
      offset_abi_cxx11_(&local_2d0,this,sVar10);
      std::operator+(&local_230,&local_3d0,&local_2d0);
      std::operator+(&local_3b0,&local_230,"while(ptr_");
      std::operator+(&local_210,&local_3b0,&node->_name);
      std::operator+(&local_390,&local_210," <= upperptr_");
      std::operator+(&local_1f0,&local_390,&node->_name);
      std::operator+(&local_1d0,&local_1f0,"[");
      std::operator+(&local_1b0,&local_1d0,&depthString);
      std::operator+(&local_370,&local_1b0,"])\n");
      offset_abi_cxx11_(&local_2f0,this,sVar10);
      std::operator+(&local_190,&local_370,&local_2f0);
      std::operator+(&local_350,&local_190,"{\n");
      offset_abi_cxx11_(&local_310,this,sVar12);
      std::operator+(&local_170,&local_350,&local_310);
      std::operator+(&local_508,&local_170,&node->_name);
      std::operator+(&local_428,&local_508,"_tuple &");
      std::operator+(&local_640,&local_428,&node->_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,&local_640,"Tuple = ");
      std::operator+(&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,&node->_name);
      std::operator+(&resetAggregates,&local_6d0,"[ptr_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,&resetAggregates,&node->_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &subProduct,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,"];\n");
      std::__cxx11::string::append((string *)&productString);
      std::__cxx11::string::~string((string *)&subProduct);
      std::__cxx11::string::~string((string *)&removedFunctions);
      std::__cxx11::string::~string((string *)&resetAggregates);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_2b0);
      offset_abi_cxx11_(&local_428,this,sVar12);
      std::operator+(&local_640,&local_428,"++ptr_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,&local_640,&node->_name);
      std::operator+(&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,";\n");
      offset_abi_cxx11_(&local_508,this,sVar10);
      std::operator+(&resetAggregates,&local_6d0,&local_508);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,&resetAggregates,"}\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &subProduct,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &removedFunctions,&local);
      std::__cxx11::string::operator=((string *)&local,(string *)&subProduct);
      std::__cxx11::string::~string((string *)&subProduct);
    }
    std::__cxx11::string::~string((string *)&removedFunctions);
    std::__cxx11::string::~string((string *)&resetAggregates);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&increasingIndexes);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::string((string *)&resetAggregates,"",(allocator *)&subProduct);
    genAggLoopStringCompressed
              ((string *)&subProduct,this,node,sVar5,depth,local_5d8,0,&resetAggregates);
    std::__cxx11::string::append((string *)&productString);
    std::__cxx11::string::~string((string *)&subProduct);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &removedFunctions,&resetAggregates,&productString);
    std::operator+((string *)&subProduct,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &removedFunctions,&local);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&subProduct);
    std::__cxx11::string::~string((string *)&removedFunctions);
    if (multifaq::cppgen::COMPRESS_AGGREGATES == '\0') {
      lVar23 = 8;
      uVar17 = 0;
      while( true ) {
        pvVar6 = (this->newAggregateRegister).
                 super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar16 = *(long *)&pvVar6[sVar5].
                           super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                           super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pvVar6[sVar5].
                                    super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                                    _M_impl.super__Vector_impl_data + 8) - lVar16) / 0x70) <= uVar17
           ) break;
        if (*(char *)(lVar16 + lVar23 * 8) == '\x01') {
          offset_abi_cxx11_((string *)&increasingIndexes,this,sVar10);
          std::operator+(&local_6d0,(string *)&increasingIndexes,"aggregateRegister[");
          std::__cxx11::to_string(&local_640,this->aggregateCounter);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,&local_6d0,&local_640);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &subProduct,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,"] = ");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&subProduct);
          std::__cxx11::string::~string((string *)&removedFunctions);
          std::__cxx11::string::~string((string *)&local_640);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&increasingIndexes);
          uVar22 = *(ulong *)(lVar16 + -0x40 + lVar23 * 8);
          uVar14 = (long)(this->listOfLoops).
                         super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->listOfLoops).
                         super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar22 < uVar14) {
            std::__cxx11::to_string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &subProduct,
                       *(unsigned_long *)
                        (*(long *)(*(long *)&(this->newAggregateRemapping).
                                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[depth].
                                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 0x18) +
                        *(long *)(lVar16 + -0x38 + lVar23 * 8) * 8));
            std::operator+(&local_6d0,"aggregateRegister[",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &subProduct);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &removedFunctions,&local_6d0,"]*");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&removedFunctions);
            std::__cxx11::string::~string((string *)&local_6d0);
            std::__cxx11::string::~string((string *)&subProduct);
            uVar14 = (long)(this->listOfLoops).
                           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->listOfLoops).
                           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
          }
          uVar22 = *(ulong *)(lVar16 + -0x10 + lVar23 * 8);
          if (uVar22 < uVar14) {
            std::__cxx11::to_string
                      ((string *)&subProduct,
                       *(unsigned_long *)
                        (*(long *)(*(long *)&(this->newAggregateRemapping).
                                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[depth].
                                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 0x18) +
                        *(long *)(lVar16 + -8 + lVar23 * 8) * 8));
            std::operator+(&local_6d0,"aggregateRegister[",(string *)&subProduct);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &removedFunctions,&local_6d0,"]*");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&removedFunctions);
            std::__cxx11::string::~string((string *)&local_6d0);
            std::__cxx11::string::~string((string *)&subProduct);
          }
          std::__cxx11::string::pop_back();
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          sVar13 = this->aggregateCounter;
          *(size_t *)
           (*(long *)(*(long *)&(this->newAggregateRemapping).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[depth].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data + sVar5 * 0x18) + uVar17 * 8) =
               sVar13;
          this->aggregateCounter = sVar13 + 1;
        }
        uVar17 = uVar17 + 1;
        lVar23 = lVar23 + 0xe;
      }
    }
    else {
      subProduct.super__Base_bitset<24UL>._M_w[0] = 0;
      removedFunctions.super__Base_bitset<24UL>._M_w[0] = 0;
      increasingIndexes.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
      local_640._M_dataplus._M_p = (pointer)0x0;
      pvVar6 = (this->newAggregateRegister).
               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar15 = pvVar6[sVar5].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar17 = ((long)*(pointer *)
                       ((long)&pvVar6[sVar5].
                               super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl
                               .super__Vector_impl_data + 8) - (long)pAVar15) / 0x70;
      for (uVar22 = 0; uVar17 != uVar22; uVar22 = uVar22 + 1) {
        if (pAVar15->postLoopAgg == true) {
          mapAggregateToIndexes
                    (this,(AggregateIndexes *)&removedFunctions,pAVar15,&depth_local,&nextLoop);
          bVar27 = uVar22 < uVar17;
          sVar13 = this->aggregateCounter;
          *(size_t *)
           (*(long *)(*(long *)&(this->newAggregateRemapping).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[depth].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data + sVar5 * 0x18) + uVar22 * 8) =
               sVar13;
          this->aggregateCounter = sVar13 + 1;
          uVar17 = uVar22 + 1;
          goto LAB_001bb499;
        }
        pAVar15 = pAVar15 + 1;
      }
      bVar27 = false;
LAB_001bb499:
      lVar23 = uVar17 * 0x70;
      for (; pvVar6 = (this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          lVar16 = *(long *)&pvVar6[sVar5].
                             super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                             super__Vector_impl_data,
          uVar17 < (ulong)(((long)*(pointer *)
                                   ((long)&pvVar6[sVar5].
                                           super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                           ._M_impl.super__Vector_impl_data + 8) - lVar16) / 0x70);
          uVar17 = uVar17 + 1) {
        if (*(char *)(lVar16 + 0x40 + lVar23) == '\x01') {
          removedFunctions.super__Base_bitset<24UL>._M_w[6] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[7] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[4] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[5] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[2] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[3] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[0] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[1] = 0;
          removedFunctions.super__Base_bitset<24UL>._M_w[8] = 0;
          mapAggregateToIndexes
                    (this,(AggregateIndexes *)&removedFunctions,(AggRegTuple *)(lVar16 + lVar23),
                     &depth_local,&nextLoop);
          bVar8 = AggregateIndexes::isIncrement
                            ((AggregateIndexes *)&removedFunctions,(AggregateIndexes *)&subProduct,
                             (size_t *)&local_640,&increasingIndexes);
          if (bVar8) {
            local_640._M_dataplus._M_p = local_640._M_dataplus._M_p + 1;
          }
          else {
            outputAggRegTupleString_abi_cxx11_
                      (&local_6d0,this,(AggregateIndexes *)&subProduct,
                       (size_t)local_640._M_dataplus._M_p,&increasingIndexes,sVar10,true);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_6d0);
            ppVar18 = &removedFunctions;
            ppVar20 = &subProduct;
            for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
              (ppVar20->super__Base_bitset<24UL>)._M_w[0] =
                   (ppVar18->super__Base_bitset<24UL>)._M_w[0];
              ppVar18 = (prod_bitset *)((long)ppVar18 + ((ulong)bVar28 * -2 + 1) * 8);
              ppVar20 = (prod_bitset *)((long)ppVar20 + ((ulong)bVar28 * -2 + 1) * 8);
            }
            local_640._M_dataplus._M_p = (pointer)0x0;
          }
          sVar13 = this->aggregateCounter;
          *(size_t *)
           (*(long *)(*(long *)&(this->newAggregateRemapping).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[depth].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data + sVar5 * 0x18) + uVar17 * 8) =
               sVar13;
          this->aggregateCounter = sVar13 + 1;
        }
        lVar23 = lVar23 + 0x70;
      }
      if (bVar27) {
        outputAggRegTupleString_abi_cxx11_
                  (&local_6d0,this,(AggregateIndexes *)&subProduct,
                   (size_t)local_640._M_dataplus._M_p,&increasingIndexes,sVar10,true);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_6d0);
      }
    }
    std::__cxx11::string::~string((string *)&resetAggregates);
    std::__cxx11::string::~string((string *)&local);
    std::__cxx11::string::~string((string *)&productString);
    uVar17 = local_3f8 + 1;
  }
  sVar10 = thisLoopID;
  uVar17 = this->aggregateCounter;
  uVar22 = uVar17;
  if (multifaq::cppgen::COMPRESS_AGGREGATES == '\0') {
    local_6e8 = 0xd;
    uVar14 = 0;
    sVar10 = local_408;
    local_6d8 = depth;
    while( true ) {
      pvVar6 = (this->newAggregateRegister).
               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar23 = *(long *)&pvVar6[sVar10].
                         super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                         super__Vector_impl_data;
      lVar16 = local_5e0;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pvVar6[sVar10].
                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar23) / 0x70) <= uVar14)
      break;
      if (*(char *)(lVar23 + -0x28 + local_6e8 * 8) == '\0') {
        offset_abi_cxx11_(&local,this,local_6d8 + lVar26);
        std::operator+(&productString,&local,"aggregateRegister[");
        std::__cxx11::to_string(&resetAggregates,this->aggregateCounter);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &removedFunctions,&productString,&resetAggregates);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &subProduct,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &removedFunctions,"] += ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&subProduct);
        std::__cxx11::string::~string((string *)&removedFunctions);
        std::__cxx11::string::~string((string *)&resetAggregates);
        std::__cxx11::string::~string((string *)&productString);
        std::__cxx11::string::~string((string *)&local);
        uVar22 = *(ulong *)(lVar23 + -0x68 + local_6e8 * 8);
        if (uVar22 < (ulong)((long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::to_string
                    ((string *)&subProduct,
                     *(unsigned_long *)
                      (*(long *)(*(long *)&(this->newAggregateRemapping).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [*(long *)(lVar23 + -0x20 + local_6e8 * 8)].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar22 * 0x18) +
                      *(long *)(lVar23 + -0x60 + local_6e8 * 8) * 8));
          std::operator+(&productString,"aggregateRegister[",(string *)&subProduct);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,&productString,"]*");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&removedFunctions);
          std::__cxx11::string::~string((string *)&productString);
          std::__cxx11::string::~string((string *)&subProduct);
        }
        if (*(char *)(lVar23 + -0x58 + local_6e8 * 8) == '\x01') {
          std::__cxx11::to_string
                    ((string *)&subProduct,
                     *(unsigned_long *)
                      (*(long *)&(this->localProductRemapping).
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[sVar10].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data +
                      *(long *)(lVar23 + -0x50 + local_6e8 * 8) * 8));
          std::operator+(&productString,"localRegister[",(string *)&subProduct);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,&productString,"]*");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&removedFunctions);
          std::__cxx11::string::~string((string *)&productString);
          std::__cxx11::string::~string((string *)&subProduct);
        }
        if (*(char *)(lVar23 + -0x18 + local_6e8 * 8) == '\x01') {
          std::__cxx11::to_string
                    ((string *)&subProduct,
                     *(unsigned_long *)
                      (*(long *)&(this->viewProductRemapping).
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[sVar10].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data +
                      *(long *)(lVar23 + -8 + local_6e8 * 8) * 8));
          std::operator+(&productString,"viewRegister[",(string *)&subProduct);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,&productString,"];");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&removedFunctions);
          std::__cxx11::string::~string((string *)&productString);
          std::__cxx11::string::~string((string *)&subProduct);
        }
        else if (*(char *)(lVar23 + -0x17 + local_6e8 * 8) == '\x01') {
          std::operator+(&local,"aggregates_",
                         this->viewName + *(long *)(lVar23 + -0x10 + local_6e8 * 8));
          std::operator+(&productString,&local,"[");
          std::__cxx11::to_string(&resetAggregates,*(unsigned_long *)(lVar23 + -8 + local_6e8 * 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,&productString,&resetAggregates);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &subProduct,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,"]*");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&subProduct);
          std::__cxx11::string::~string((string *)&removedFunctions);
          std::__cxx11::string::~string((string *)&resetAggregates);
          std::__cxx11::string::~string((string *)&productString);
          std::__cxx11::string::~string((string *)&local);
        }
        if (*(char *)(lVar23 + local_6e8 * 8) == '\x01') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        uVar22 = *(ulong *)(lVar23 + -0x38 + local_6e8 * 8);
        if (uVar22 < (ulong)((long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::to_string
                    ((string *)&subProduct,
                     *(unsigned_long *)
                      (*(long *)(*(long *)&(this->newAggregateRemapping).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[depth_local].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar22 * 0x18) +
                      *(long *)(lVar23 + -0x30 + local_6e8 * 8) * 8));
          std::operator+(&productString,"aggregateRegister[",(string *)&subProduct);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &removedFunctions,&productString,"]*");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&removedFunctions);
          std::__cxx11::string::~string((string *)&productString);
          std::__cxx11::string::~string((string *)&subProduct);
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        sVar10 = this->aggregateCounter;
        local_6d8 = depth_local;
        *(size_t *)
         (*(long *)(*(long *)&(this->newAggregateRemapping).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[depth_local].
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data + thisLoopID * 0x18) + uVar14 * 8) =
             sVar10;
        uVar22 = sVar10 + 1;
        this->aggregateCounter = uVar22;
        sVar10 = thisLoopID;
      }
      uVar14 = uVar14 + 1;
      local_6e8 = local_6e8 + 0xe;
    }
  }
  else {
    subProduct.super__Base_bitset<24UL>._M_w[0] = 0;
    removedFunctions.super__Base_bitset<24UL>._M_w[0] = 0;
    local._M_dataplus._M_p = (pointer)0x0;
    resetAggregates._M_dataplus._M_p = (pointer)0x0;
    pvVar6 = (this->newAggregateRegister).
             super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar23 = thisLoopID * 0x18;
    pAVar15 = pvVar6[thisLoopID].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar14 = ((long)*(pointer *)
                     ((long)&pvVar6[thisLoopID].
                             super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                             super__Vector_impl_data + 8) - (long)pAVar15) / 0x70;
    for (uVar24 = 0; uVar14 != uVar24; uVar24 = uVar24 + 1) {
      if (pAVar15->postLoopAgg == false) {
        mapAggregateToIndexes(this,(AggregateIndexes *)&subProduct,pAVar15,&depth_local,&thisLoopID)
        ;
        bVar27 = uVar24 < uVar14;
        sVar12 = this->aggregateCounter;
        *(size_t *)
         (*(long *)(*(long *)&(this->newAggregateRemapping).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[depth_local].
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data + lVar23) + uVar24 * 8) = sVar12;
        uVar22 = sVar12 + 1;
        this->aggregateCounter = uVar22;
        uVar14 = uVar24 + 1;
        goto LAB_001bbcd9;
      }
      pAVar15 = pAVar15 + 1;
    }
    bVar27 = false;
LAB_001bbcd9:
    sVar5 = depth_local;
    sVar12 = lVar26 + depth_local;
    lVar26 = uVar14 * 0x70;
    while( true ) {
      lVar16 = local_5e0;
      pvVar6 = (this->newAggregateRegister).
               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = *(long *)&pvVar6[sVar10].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pvVar6[sVar10].
                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar7) / 0x70) <= uVar14)
      break;
      if (*(char *)(lVar7 + 0x40 + lVar26) == '\0') {
        removedFunctions.super__Base_bitset<24UL>._M_w[6] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[7] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[4] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[5] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[8] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[2] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[3] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[0] = 0;
        removedFunctions.super__Base_bitset<24UL>._M_w[1] = 0;
        mapAggregateToIndexes
                  (this,(AggregateIndexes *)&removedFunctions,
                   (AggRegTuple *)
                   (*(long *)&pvVar6[sVar10].
                              super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                              super__Vector_impl_data + lVar26),&depth_local,&thisLoopID);
        bVar8 = AggregateIndexes::isIncrement
                          ((AggregateIndexes *)&removedFunctions,(AggregateIndexes *)&subProduct,
                           (size_t *)&resetAggregates,(bitset<7UL> *)&local);
        if (bVar8) {
          resetAggregates._M_dataplus._M_p = resetAggregates._M_dataplus._M_p + 1;
        }
        else {
          outputAggRegTupleString_abi_cxx11_
                    (&productString,this,(AggregateIndexes *)&subProduct,
                     (size_t)resetAggregates._M_dataplus._M_p,(bitset<7UL> *)&local,sVar12,false);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&productString);
          pAVar19 = (AggregateIndexes *)&removedFunctions;
          pAVar21 = (AggregateIndexes *)&subProduct;
          for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pAVar21->present).super__Base_bitset<1UL>._M_w =
                 (pAVar19->present).super__Base_bitset<1UL>._M_w;
            pAVar19 = (AggregateIndexes *)((long)pAVar19 + (ulong)bVar28 * -0x10 + 8);
            pAVar21 = (AggregateIndexes *)((long)pAVar21 + (ulong)bVar28 * -0x10 + 8);
          }
          resetAggregates._M_dataplus._M_p = (pointer)0x0;
        }
        sVar13 = this->aggregateCounter;
        *(size_t *)
         (*(long *)(*(long *)&(this->newAggregateRemapping).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar5].
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data + lVar23) + uVar14 * 8) = sVar13;
        uVar22 = sVar13 + 1;
        this->aggregateCounter = uVar22;
      }
      uVar14 = uVar14 + 1;
      lVar26 = lVar26 + 0x70;
    }
    if (bVar27) {
      outputAggRegTupleString_abi_cxx11_
                (&productString,this,(AggregateIndexes *)&subProduct,
                 (size_t)resetAggregates._M_dataplus._M_p,(bitset<7UL> *)&local,sVar12,false);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&productString);
      uVar22 = this->aggregateCounter;
    }
  }
  if (uVar17 < uVar22) {
    lVar26 = 3;
    if (lVar16 != 0) {
      lVar26 = lVar16 + 2;
    }
    offset_abi_cxx11_(&local_6d0,this,lVar26 + depth_local);
    std::operator+(&resetAggregates,&local_6d0,"memset(&aggregateRegister[");
    std::__cxx11::to_string((string *)&increasingIndexes,uVar17);
    std::operator+(&local,&resetAggregates,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &increasingIndexes);
    std::operator+(&productString,&local,"], 0, sizeof(double) * ");
    std::__cxx11::to_string(&local_640,this->aggregateCounter - uVar17);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &removedFunctions,&productString,&local_640);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subProduct,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &removedFunctions,");\n");
    std::__cxx11::string::append((string *)resetString);
    std::__cxx11::string::~string((string *)&subProduct);
    std::__cxx11::string::~string((string *)&removedFunctions);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&productString);
    std::__cxx11::string::~string((string *)&local);
    std::__cxx11::string::~string((string *)&increasingIndexes);
    std::__cxx11::string::~string((string *)&resetAggregates);
    std::__cxx11::string::~string((string *)&local_6d0);
  }
  std::__cxx11::string::~string((string *)&depthString);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genAggLoopStringCompressed(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews,const size_t numOfOutViewLoops,
    std::string& resetString)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[thisLoopID];
    size_t numOfLoops = thisLoop.count() + numOfOutViewLoops;
    
    std::string returnString = "";
    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];
        
        // std::cout << product << std::endl;
        
        bool decomposedProduct = false;
        std::string productString = "";

        // We now check if parts of the product have already been computed 
        if (product.count() > 1)
        {
            prod_bitset subProduct = product;
            prod_bitset removedFunctions;

            size_t subProductID;

            bool foundSubProduct = false;
            while (!foundSubProduct && subProduct.count() > 1)
            {
                size_t highestPosition = 0;
                // need to continue with this the next loop
                for (size_t f = NUM_OF_FUNCTIONS; f > 0; f--)
                {
                    if (subProduct[f])
                    {
                        highestPosition = f;
                        break;
                    }
                }
                
                subProduct.reset(highestPosition);
                removedFunctions.set(highestPosition);

                auto local_it = localProductMap[thisLoopID].find(subProduct);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = true;
                    subProductID = local_it->second;
                }
            }
            

            if (foundSubProduct)
            {
                std::string local = std::to_string(
                    localProductRemapping[thisLoopID][subProductID]);

                productString += "localRegister["+local+"]*";
                    
                auto local_it = localProductMap[thisLoopID].find(removedFunctions);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = false;
                    subProductID = local_it->second;

                    local = std::to_string(
                        localProductRemapping[thisLoopID][subProductID]);
                    productString += "localRegister["+local+"]";
                }
                else
                {
                    productString += genProductString(
                        node,contributingViews,removedFunctions);
                }

                decomposedProduct = true;
            }
        }
        
        // We turn the product into a string
        if (!decomposedProduct)
            productString += genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString + ";\n";
        
        // increment the counter and update the remapping array
        localProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size(); ++viewProd)
    {   
        std::string viewProduct = "";
        for (const std::pair<size_t, size_t>& viewAgg : viewProductList[thisLoopID][viewProd])
        {
            viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
                std::to_string(viewAgg.second)+"]*";
        }   
        viewProduct.pop_back();

        returnString += offset(3+depth+numOfLoops)+
            "viewRegister["+std::to_string(viewCounter)+"] = "+
            viewProduct +";\n";

        // Increment the counter and update the remapping array
        viewProductRemapping[thisLoopID][viewProd] = viewCounter;
        ++viewCounter;
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) == thisLoop))
        {
            size_t viewID = viewsPerLoop[nextLoop].find_first();

            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            std::string resetAggregates = "";

            loopString += genAggLoopStringCompressed(
                node, nextLoop, depth, contributingViews, 0, resetAggregates);

            returnString += resetAggregates + loopString + closeLoopString;

            if (COMPRESS_AGGREGATES)
            {                    
                // After recurse, add the aggregates that have been added with post FLAG
                AggregateIndexes bench, aggIdx;
                std::bitset<7> increasingIndexes;
                size_t aggID = 0, off = 0;

                bool addedAggregates = false;

                // Loop to identify the first bench
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;

                        ++aggID; // TODO: Make sure that this is necessary!!
                        addedAggregates = true;
                        break;
                    }
                }   
            
                // Loop over all other aggregates 
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        aggIdx.reset();
                    
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        if (aggIdx.isIncrement(bench,off,increasingIndexes))
                        {
                            ++off;
                        }
                        else
                        {
                            // If not, output bench and all offset aggregates
                            returnString += outputAggRegTupleString(
                                bench,off,increasingIndexes, 3+depth+numOfLoops,true);
                        
                            // make aggregate the bench and set offset to 0
                            bench = aggIdx;
                            off = 0;
                        }

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }

                // Output bench -- and any further aggregates (if there were any)
                if (addedAggregates)
                    returnString += outputAggRegTupleString(
                        bench,off,increasingIndexes,3+depth+numOfLoops,true);
            }
            else
            {
                // here we output the aggregates uncompressed -TODO: we could probably
                // remove this and incorporate it in the previous part
            
                // After recurse, add the aggregates that have been added with post FLAG
                for (size_t aggID = 0; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        // We use a mapping to the correct index
                        returnString += offset(3+depth+numOfLoops)+
                            "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

                        if (regTuple.previous.first < listOfLoops.size())
                        {
                            std::string local = std::to_string(
                                newAggregateRemapping[depth]
                                [regTuple.previous.first]
                                [regTuple.previous.second]);
                            returnString += "aggregateRegister["+local+"]*";
                        }

                        if (regTuple.postLoop.first < listOfLoops.size())
                        {
                            std::string post = std::to_string(
                                newAggregateRemapping[depth][regTuple.postLoop.first]
                                [regTuple.postLoop.second]); 
                            returnString += "aggregateRegister["+post+"]*";
                        }
                        
                        returnString.pop_back();
                        returnString += ";\n";
            
                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }
            }
        }
        else break;
    }
    
    size_t startingOffset = aggregateCounter;
    
    if (COMPRESS_AGGREGATES)
    {        
        // After recurse, add the aggregates that have been added with post FLAG
        AggregateIndexes bench, aggIdx;
        std::bitset<7> increasingIndexes;
        size_t aggID = 0, off = 0;
    
        bool addedAggregates = false;

        // Loop to identify the first bench
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                mapAggregateToIndexes
                    (bench,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);
            
                addedAggregates = true;

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;

                ++aggID;
                break;
            }
        }

        // Loop over all other aggregates 
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                aggIdx.reset();
            
                mapAggregateToIndexes
                    (aggIdx,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputAggRegTupleString(bench,off,increasingIndexes,
                                                            3+depth+numOfLoops,false);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                }

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }

        // Output bench -- and any further aggregates (if there were any)
        if (addedAggregates)
            returnString += outputAggRegTupleString(
                bench,off,increasingIndexes,3+depth+numOfLoops,false);
    }
    else
    {
        
        for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                // We use a mapping to the correct index
                returnString += offset(3+depth+numOfLoops)+
                    "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

                if (regTuple.previous.first < listOfLoops.size())
                {
                    std::string prev = std::to_string(
                        newAggregateRemapping[regTuple.prevDepth]
                        [regTuple.previous.first]
                        [regTuple.previous.second]);
                
                    returnString += "aggregateRegister["+prev+"]*";
                }
            
                if (regTuple.product.first)
                {
                    std::string local = std::to_string(
                        localProductRemapping[thisLoopID][regTuple.product.second]
                        );
                    returnString += "localRegister["+local+"]*";
                }
        
                if (regTuple.newViewProduct)
                {
                    std::string view = std::to_string(
                        viewProductRemapping[thisLoopID][regTuple.viewAgg.second]);
                    returnString += "viewRegister["+view+"];";
                }
                else if (regTuple.singleViewAgg)
                {
                    returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                        std::to_string(regTuple.viewAgg.second)+"]*";
                }
            
                if (regTuple.multiplyByCount)
                    returnString +=  "count*";

                if (regTuple.postLoop.first < listOfLoops.size())
                {
                    std::string postLoop = std::to_string(
                        newAggregateRemapping[depth][regTuple.postLoop.first]
                        [regTuple.postLoop.second]);
                    returnString += "aggregateRegister["+postLoop+"]*";
                }
            
                returnString.pop_back();
                returnString += ";\n";
            
                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }
    }
    

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    return returnString;
}